

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::Floating::WithinRelMatcher::describe_abi_cxx11_(WithinRelMatcher *this)

{
  ReusableStringStream *this_00;
  long in_RSI;
  string *in_RDI;
  ReusableStringStream *this_01;
  ReusableStringStream sstr;
  ReusableStringStream *in_stack_ffffffffffffff78;
  ReusableStringStream *in_stack_ffffffffffffff80;
  ReusableStringStream local_28;
  
  ReusableStringStream::ReusableStringStream(&local_28);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff80,(char (*) [5])in_stack_ffffffffffffff78);
  ReusableStringStream::operator<<(in_stack_ffffffffffffff80,(double *)in_stack_ffffffffffffff78);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff80,(char (*) [13])in_stack_ffffffffffffff78);
  this_01 = (ReusableStringStream *)(*(double *)(in_RSI + 0x38) * 100.0);
  this_00 = ReusableStringStream::operator<<
                      (in_stack_ffffffffffffff80,(double *)in_stack_ffffffffffffff78);
  ReusableStringStream::operator<<(this_00,(char (*) [16])in_stack_ffffffffffffff78);
  ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff78);
  ReusableStringStream::~ReusableStringStream(this_01);
  return in_RDI;
}

Assistant:

std::string WithinRelMatcher::describe() const {
        Catch::ReusableStringStream sstr;
        sstr << "and " << m_target << " are within " << m_epsilon * 100. << "% of each other";
        return sstr.str();
    }